

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O2

qint64 __thiscall
QUtcTimeZonePrivate::offsetFromUtcString(QUtcTimeZonePrivate *this,QByteArrayView id)

{
  char cVar1;
  bool bVar2;
  ushort uVar3;
  int iVar4;
  qsizetype qVar5;
  ushort uVar6;
  qint64 qVar7;
  uint uVar8;
  int iVar9;
  long in_FS_OFFSET;
  QByteArrayView other;
  bool ok;
  QLatin1String local_b8;
  iterator __begin1;
  QByteArrayView id_local;
  QStringTokenizerBase<QLatin1String,_QChar> local_58;
  long local_38;
  
  id_local.m_data = (storage_type *)id.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  id_local.m_size = (qsizetype)this;
  qVar5 = QByteArrayView::lengthHelperCharArray("UTC",4);
  other.m_data = "UTC";
  other.m_size = qVar5;
  bVar2 = QByteArrayView::startsWith(&id_local,other);
  qVar7 = -0x80000000;
  if ((bVar2) && (4 < id_local.m_size)) {
    cVar1 = id_local.m_data[3];
    if ((cVar1 == '-') || (cVar1 == '+')) {
      local_58.m_haystack = (QLatin1String)QByteArrayView::mid(&id_local,4,-1);
      local_58.super_QStringTokenizerBaseBase.m_sb.
      super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
      super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
           (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
      local_58.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
      local_58.m_needle.ucs = L':';
      __begin1.current.state.extra = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __begin1.current.state.start = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __begin1.current.state.end = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __begin1.current.value.m_data = &DAT_aaaaaaaaaaaaaaaa;
      __begin1.current._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      __begin1.tokenizer = (QStringTokenizerBase<QLatin1String,_QChar> *)&DAT_aaaaaaaaaaaaaaaa;
      __begin1.current.value.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::iterator(&__begin1,&local_58);
      uVar8 = 0;
      iVar9 = 0;
      while (__begin1.current.ok == true) {
        local_b8.m_size = __begin1.current.value.m_size;
        local_b8.m_data = __begin1.current.value.m_data;
        ok = false;
        uVar3 = QLatin1String::toUShort(&local_b8,&ok,10);
        if (ok != true) {
LAB_003aced9:
          qVar7 = -0x80000000;
          goto LAB_003acf0e;
        }
        uVar6 = 0x3c;
        if (uVar8 == 0) {
          uVar6 = 0x18;
        }
        if ((uVar6 <= uVar3) || (2 < uVar8)) goto LAB_003aced9;
        uVar8 = uVar8 + 1;
        iVar9 = iVar9 * 0x3c + (uint)uVar3;
        QStringTokenizerBase<QLatin1String,_QChar>::iterator::advance(&__begin1);
      }
      qVar7 = -0x80000000;
      if (uVar8 != 0) {
        iVar4 = 3 - uVar8;
        while (bVar2 = iVar4 != 0, iVar4 = iVar4 + -1, bVar2) {
          iVar9 = iVar9 * 0x3c;
        }
        iVar4 = -iVar9;
        if (cVar1 != '-') {
          iVar4 = iVar9;
        }
        qVar7 = (qint64)iVar4;
      }
    }
  }
LAB_003acf0e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar7;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QUtcTimeZonePrivate::offsetFromUtcString(QByteArrayView id)
{
    // Convert reasonable UTC[+-]\d+(:\d+){,2} to offset in seconds.
    // Assumption: id has already been tried as a CLDR UTC offset ID (notably
    // including plain "UTC" itself) and a system offset ID; it's neither.
    if (!id.startsWith("UTC") || id.size() < 5)
        return invalidSeconds(); // Doesn't match
    const char signChar = id.at(3);
    if (signChar != '-' && signChar != '+')
        return invalidSeconds(); // No sign
    const int sign = signChar == '-' ? -1 : 1;

    qint32 seconds = 0;
    int prior = 0; // Number of fields parsed thus far
    for (auto offset : QLatin1StringView(id.mid(4)).tokenize(':'_L1)) {
        bool ok = false;
        unsigned short field = offset.toUShort(&ok);
        // Bound hour above at 24, minutes and seconds at 60:
        if (!ok || field >= (prior ? 60 : 24))
            return invalidSeconds();
        seconds = seconds * 60 + field;
        if (++prior > 3)
            return invalidSeconds(); // Too many numbers
    }

    if (!prior)
        return invalidSeconds(); // No numbers

    while (prior++ < 3)
        seconds *= 60;

    return seconds * sign;
}